

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::Type> * __thiscall
capnp::compiler::Compiler::CompiledType::getSchema
          (Maybe<capnp::Type> *__return_storage_ptr__,CompiledType *this)

{
  Compiler *pCVar1;
  Builder target;
  Reader proto;
  Type TVar2;
  ArrayPtr<capnp::word> firstSegment;
  Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  Builder builder;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  MallocMessageBuilder message;
  word scratch [32];
  
  memset(scratch,0,0x100);
  firstSegment.size_ = 0x20;
  firstSegment.ptr = scratch;
  MallocMessageBuilder::MallocMessageBuilder(&message,firstSegment,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::schema::Type>(&builder,&message.super_MessageBuilder);
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockShared
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)&lock,
             &this->compiler->impl);
  target._builder.capTable = builder._builder.capTable;
  target._builder.segment = builder._builder.segment;
  target._builder.data = builder._builder.data;
  target._builder.pointers = builder._builder.pointers;
  target._builder.dataSize = builder._builder.dataSize;
  target._builder.pointerCount = builder._builder.pointerCount;
  target._builder._38_2_ = builder._builder._38_2_;
  BrandedDecl::compileAsType(&(this->decl).value,(ErrorReporter *)&ErrorIgnorer::instance,target);
  kj::Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked(&lock);
  pCVar1 = this->compiler;
  capnp::_::StructBuilder::asReader(&builder._builder);
  proto._reader.capTable = (CapTableReader *)uStack_240;
  proto._reader.segment = (SegmentReader *)local_248;
  proto._reader.data = (void *)local_238;
  proto._reader.pointers = (WirePointer *)uStack_230;
  proto._reader._32_8_ = local_228;
  proto._reader._40_8_ = uStack_220;
  TVar2 = SchemaLoader::getType(&pCVar1->loader,proto,(Schema)0x277800);
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value = TVar2;
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Type> Compiler::CompiledType::getSchema() {
  capnp::word scratch[32];
  memset(&scratch, 0, sizeof(scratch));
  capnp::MallocMessageBuilder message(scratch);
  auto builder = message.getRoot<schema::Type>();

  {
    auto lock = compiler.impl.lockShared();
    decl.get(lock).compileAsType(ErrorIgnorer::instance, builder);
  }

  // No need to pass `scope` as second parameter since CompiledType always represents a type
  // expression evaluated free-standing, not in any scope.
  return compiler.loader.getType(builder.asReader());
}